

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O1

int ogg_stream_pageout_fill(ogg_stream_state *os,ogg_page *og,int nfill)

{
  int iVar1;
  long lVar2;
  uint *__dest;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uchar uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  
  if ((os == (ogg_stream_state *)0x0) || (os->body_data == (uchar *)0x0)) {
    return 0;
  }
  if (((os->e_o_s != 0) && (os->lacing_fill != 0)) ||
     ((bVar13 = false, os->lacing_fill != 0 && (os->b_o_s == 0)))) {
    iVar3 = ogg_stream_flush_i(os,og,1,nfill);
    return iVar3;
  }
  lVar2 = os->lacing_fill;
  lVar4 = 0xff;
  if (lVar2 < 0xff) {
    lVar4 = lVar2;
  }
  uVar6 = (uint)lVar4;
  if (os == (ogg_stream_state *)0x0) {
    bVar14 = true;
  }
  else {
    bVar14 = os->body_data == (uchar *)0x0;
  }
  iVar3 = 0;
  if (!(bool)(uVar6 == 0 | bVar14)) {
    iVar1 = os->b_o_s;
    if (iVar1 == 0) {
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      else {
        uVar10 = 0;
        do {
          if ((char)os->lacing_vals[uVar10] != -1) {
            uVar6 = (int)uVar10 + 1;
            lVar4 = 0;
            goto LAB_001e52e2;
          }
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar10);
      }
      lVar4 = 0;
    }
    else {
      if ((int)uVar6 < 1) {
        lVar4 = -1;
        uVar6 = 0;
      }
      else {
        lVar4 = -1;
        uVar10 = 0;
        iVar3 = 0;
        iVar5 = 0;
        lVar12 = 0;
        do {
          if ((nfill < lVar12) && (3 < iVar3)) {
            bVar13 = true;
            uVar6 = (uint)uVar10;
            break;
          }
          iVar3 = 0;
          if ((ulong)*(byte *)(os->lacing_vals + uVar10) != 0xff) {
            lVar4 = os->granule_vals[uVar10];
            iVar5 = iVar5 + 1;
            iVar3 = iVar5;
          }
          lVar12 = lVar12 + (ulong)*(byte *)(os->lacing_vals + uVar10);
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar10);
      }
      if (uVar6 == 0xff) {
        bVar13 = true;
      }
    }
LAB_001e52e2:
    iVar3 = 0;
    if (bVar13) {
      builtin_memcpy(os->header,"OggS",5);
      os->header[5] = '\0';
      __dest = (uint *)os->lacing_vals;
      bVar13 = (*__dest >> 8 & 1) == 0;
      uVar7 = bVar13 + '\x02';
      if (iVar1 != 0) {
        uVar7 = bVar13;
      }
      os->header[5] = uVar7;
      lVar12 = (long)(int)uVar6;
      if ((os->e_o_s != 0) && (lVar2 == lVar12)) {
        os->header[5] = os->header[5] | 4;
      }
      os->b_o_s = 1;
      lVar8 = 0x56;
      do {
        os->header[lVar8 + -0x50] = (uchar)lVar4;
        lVar4 = lVar4 >> 8;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x5e);
      lVar4 = os->serialno;
      lVar8 = 0x5e;
      do {
        os->header[lVar8 + -0x50] = (uchar)lVar4;
        lVar4 = lVar4 >> 8;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x62);
      if (os->pageno == -1) {
        os->pageno = 0;
      }
      lVar4 = os->pageno;
      os->pageno = lVar4 + 1;
      lVar8 = 0x62;
      do {
        os->header[lVar8 + -0x50] = (uchar)lVar4;
        lVar4 = lVar4 >> 8;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x66);
      os->header[0x16] = '\0';
      os->header[0x17] = '\0';
      os->header[0x18] = '\0';
      os->header[0x19] = '\0';
      os->header[0x1a] = (uchar)uVar6;
      uVar10 = 0;
      if (0 < (int)uVar6) {
        uVar9 = 0;
        do {
          uVar11 = __dest[uVar9];
          os->header[uVar9 + 0x1b] = (uchar)uVar11;
          uVar11 = (int)uVar10 + (uVar11 & 0xff);
          uVar10 = (ulong)uVar11;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
        uVar10 = (ulong)uVar11;
      }
      og->header = os->header;
      os->header_fill = uVar6 + 0x1b;
      og->header_len = (long)(int)(uVar6 + 0x1b);
      og->body = os->body_data + os->body_returned;
      og->body_len = uVar10;
      os->lacing_fill = lVar2 - lVar12;
      memmove(__dest,__dest + lVar12,(lVar2 - lVar12) * 4);
      memmove(os->granule_vals,os->granule_vals + lVar12,os->lacing_fill << 3);
      os->body_returned = os->body_returned + uVar10;
      ogg_page_checksum_set(og);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int ogg_stream_pageout_fill(ogg_stream_state *os, ogg_page *og, int nfill){
  int force=0;
  if(ogg_stream_check(os)) return 0;

  if((os->e_o_s&&os->lacing_fill) ||          /* 'were done, now flush' case */
     (os->lacing_fill&&!os->b_o_s))           /* 'initial header page' case */
    force=1;

  return(ogg_stream_flush_i(os,og,force,nfill));
}